

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_fill_range(mpack_reader_t *reader,char *p,size_t min_bytes,size_t max_bytes)

{
  bool bVar1;
  size_t sVar2;
  size_t count;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if (min_bytes <= uVar3) {
      return uVar3;
    }
    sVar2 = (*reader->fill)(reader,p + uVar3,max_bytes - uVar3);
    if (reader->error == mpack_ok) {
      if (sVar2 + 1 < 2) {
        reader->error = mpack_error_io;
        reader->end = reader->data;
        if (reader->error_fn != (mpack_reader_error_t)0x0) {
          (*reader->error_fn)(reader,mpack_error_io);
        }
        goto LAB_00106f33;
      }
      uVar3 = uVar3 + sVar2;
      bVar1 = true;
    }
    else {
LAB_00106f33:
      bVar1 = false;
    }
    if (!bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

MPACK_NOINLINE static size_t mpack_fill_range(mpack_reader_t* reader, char* p, size_t min_bytes, size_t max_bytes) {
    mpack_assert(reader->fill != NULL, "mpack_fill_range() called with no fill function?");
    mpack_assert(min_bytes > 0, "cannot fill zero bytes!");
    mpack_assert(max_bytes >= min_bytes, "min_bytes %i cannot be larger than max_bytes %i!",
            (int)min_bytes, (int)max_bytes);

    size_t count = 0;
    while (count < min_bytes) {
        size_t read = reader->fill(reader, p + count, max_bytes - count);

        // Reader fill functions can flag an error or return 0 on failure. We
        // also guard against functions that -1 just in case.
        if (mpack_reader_error(reader) != mpack_ok)
            return 0;
        if (read == 0 || read == ((size_t)(-1))) {
            mpack_reader_flag_error(reader, mpack_error_io);
            return 0;
        }

        count += read;
    }
    return count;
}